

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDComponentPoint *
ON_SubDComponentPoint::BestPickPoint
          (ON_SubDComponentPoint *__return_storage_ptr__,ON_PickType pick_type,
          double vertex_depth_bias,double edge_depth_bias,ON_SubDComponentPoint *A,
          ON_SubDComponentPoint *B)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  sbyte sVar6;
  uint uVar7;
  long lVar8;
  double *pdVar9;
  ON_SubDComponentPoint *pOVar10;
  ON_PickPoint *pOVar11;
  ON_PickPoint *b;
  ON_SubDComponentPoint *pOVar12;
  ON_PickPoint *pOVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  double dVar17;
  double b_00;
  ON_PickPoint biased_B;
  ON_PickPoint biased_A;
  double local_f0;
  ON_PickPoint local_c0;
  ON_PickPoint local_78;
  
  bVar16 = 0;
  pOVar11 = &A->m_pick_point;
  b = &B->m_pick_point;
  iVar3 = ON_PickPoint::Compare(pOVar11,b);
  bVar5 = (byte)(A->m_component_ptr).m_ptr & 6;
  uVar7 = (uint)(B->m_component_ptr).m_ptr & 6;
  sVar6 = (sbyte)uVar7;
  bVar15 = 0x2e >> sVar6;
  bVar2 = (byte)(0x6020402020200 >> bVar5 * '\b');
  bVar14 = (byte)(0x6020402020200 >> (sbyte)(uVar7 << 3));
  pOVar10 = __return_storage_ptr__;
  if (bVar2 == bVar14) {
    if (iVar3 < 0) {
      A = B;
    }
LAB_005d13c1:
    lVar8 = 10;
    B = A;
LAB_005d13e4:
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pOVar10->m_component_ptr).m_ptr = (B->m_component_ptr).m_ptr;
      B = (ON_SubDComponentPoint *)((long)B + (ulong)bVar16 * -0x10 + 8);
      pOVar10 = (ON_SubDComponentPoint *)((long)pOVar10 + (ulong)bVar16 * -0x10 + 8);
    }
    return __return_storage_ptr__;
  }
  if (1U >> bVar5 == 1) {
    lVar8 = 10;
    goto LAB_005d13e4;
  }
  if (1U >> sVar6 != 0) goto LAB_005d13c1;
  switch(bVar5) {
  case 0:
    uVar7 = -(uint)(bVar2 < bVar14);
    goto LAB_005d1440;
  case 2:
    uVar7 = 0xffffffff;
    goto LAB_005d1444;
  case 4:
    bVar2 = bVar15;
    break;
  case 6:
    bVar2 = bVar15 | 0x10U >> sVar6;
  }
  uVar7 = (bVar2 & 1) - 1;
LAB_005d1440:
  uVar7 = uVar7 | 1;
LAB_005d1444:
  if (pick_type == PointPick) {
    if ((int)uVar7 < 1) {
      bVar1 = Internal_FirstIsPartOfSecond(A,B);
      pOVar10 = A;
      if ((byte)(bVar1 & 0x3fU >> sVar6 & 0x3fU >> bVar5) == 0) goto LAB_005d1689;
    }
    else {
      bVar1 = Internal_FirstIsPartOfSecond(B,A);
      pOVar10 = B;
      if ((byte)(bVar1 & 0x3fU >> sVar6 & 0x3fU >> bVar5) != 1) {
LAB_005d1689:
        pOVar13 = &local_78;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pOVar13->m_point).x = (pOVar11->m_point).x;
          pOVar11 = (ON_PickPoint *)((long)pOVar11 + (ulong)bVar16 * -0x10 + 8);
          pOVar13 = (ON_PickPoint *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        }
        pOVar11 = &local_c0;
        for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
          (pOVar11->m_point).x = (b->m_point).x;
          b = (ON_PickPoint *)((long)b + (ulong)bVar16 * -0x10 + 8);
          pOVar11 = (ON_PickPoint *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
        }
        if ((((int)uVar7 < 1) && (0.0 < local_78.m_distance)) && (local_78.m_distance <= 1.0)) {
          local_78.m_distance = 0.0;
        }
        if (((0 < (int)uVar7) && (0.0 < local_c0.m_distance)) && (local_c0.m_distance <= 1.0)) {
          local_c0.m_distance = 0.0;
        }
        goto LAB_005d14cc;
      }
    }
    pOVar12 = __return_storage_ptr__;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pOVar12->m_component_ptr).m_ptr = (pOVar10->m_component_ptr).m_ptr;
      pOVar10 = (ON_SubDComponentPoint *)((long)pOVar10 + (ulong)bVar16 * -0x10 + 8);
      pOVar12 = (ON_SubDComponentPoint *)((long)pOVar12 + (ulong)bVar16 * -0x10 + 8);
    }
    dVar17 = (A->m_pick_point).m_distance;
    b_00 = (B->m_pick_point).m_distance;
    goto LAB_005d1641;
  }
  pOVar13 = &local_78;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pOVar13->m_point).x = (pOVar11->m_point).x;
    pOVar11 = (ON_PickPoint *)((long)pOVar11 + (ulong)bVar16 * -0x10 + 8);
    pOVar13 = (ON_PickPoint *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  pOVar11 = &local_c0;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pOVar11->m_point).x = (b->m_point).x;
    b = (ON_PickPoint *)((long)b + (ulong)bVar16 * -0x10 + 8);
    pOVar11 = (ON_PickPoint *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
  }
LAB_005d14cc:
  pdVar9 = &local_78.m_depth;
  bVar2 = 0x40U >> bVar5 | 0x40U >> sVar6;
  if (((1.23432101234321e+308 <= vertex_depth_bias) || (vertex_depth_bias <= 0.0)) ||
     (((0x2eU >> bVar5 | bVar15) & 1) == 0)) {
    local_f0 = 0.0;
    if ((((((0x10U >> bVar5 | 0x10U >> sVar6) & 1) != 0) && (0.0 < edge_depth_bias)) &&
        (edge_depth_bias < 1.23432101234321e+308)) && ((bVar2 & 1) != 0)) {
      bVar1 = Internal_FirstIsPartOfSecond(A,B);
      edge_depth_bias = edge_depth_bias;
      if (!bVar1) {
        bVar1 = Internal_FirstIsPartOfSecond(B,A);
        goto joined_r0x005d173c;
      }
      goto LAB_005d1591;
    }
  }
  else {
    bVar1 = Internal_FirstIsPartOfSecond(A,B);
    edge_depth_bias = vertex_depth_bias;
    if (!bVar1) {
      bVar1 = Internal_FirstIsPartOfSecond(B,A);
      edge_depth_bias = vertex_depth_bias;
joined_r0x005d173c:
      local_f0 = 0.0;
      pdVar9 = &local_c0.m_depth;
      if (!bVar1) goto LAB_005d15a7;
    }
LAB_005d1591:
    local_f0 = edge_depth_bias;
    *pdVar9 = *pdVar9 + local_f0;
  }
LAB_005d15a7:
  iVar3 = ON_PickPoint::Compare(&local_78,&local_c0);
  pOVar10 = A;
  if (iVar3 < 0) {
    pOVar10 = B;
  }
  pOVar12 = __return_storage_ptr__;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pOVar12->m_component_ptr).m_ptr = (pOVar10->m_component_ptr).m_ptr;
    pOVar10 = (ON_SubDComponentPoint *)((long)pOVar10 + (ulong)bVar16 * -0x10 + 8);
    pOVar12 = (ON_SubDComponentPoint *)((long)pOVar12 + (ulong)bVar16 * -0x10 + 8);
  }
  uVar4 = 0x6020402020200 >>
          (sbyte)(((uint)(__return_storage_ptr__->m_component_ptr).m_ptr & 6) << 3);
  if ((char)uVar4 != '\x02') {
    if (((uint)uVar4 & 0xff) != 4) {
      return __return_storage_ptr__;
    }
    if ((bVar2 & 1) == 0) {
      return __return_storage_ptr__;
    }
  }
  if (local_f0 < ABS((A->m_pick_point).m_depth - (B->m_pick_point).m_depth)) {
    return __return_storage_ptr__;
  }
  dVar17 = (A->m_pick_point).m_distance;
  b_00 = (B->m_pick_point).m_distance;
LAB_005d1641:
  dVar17 = ON_Min(dVar17,b_00);
  (__return_storage_ptr__->m_pick_point).m_distance = dVar17;
  dVar17 = ON_Max((A->m_pick_point).m_depth,(B->m_pick_point).m_depth);
  (__return_storage_ptr__->m_pick_point).m_depth = dVar17;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentPoint ON_SubDComponentPoint::BestPickPoint(
  ON_PickType pick_type,
  double vertex_depth_bias,
  double edge_depth_bias,
  const ON_SubDComponentPoint& A,
  const ON_SubDComponentPoint& B
)
{
  // If you're working on a bug where somebody isn't able to pick the SubD component
  // they thought they clicked on, then you're in the right place.
  // Mikko has done lots of work in this area and be sure to retest RH-52172 and RH-52173 (fixed 3 May 2019).
  // Also, retest RH-59666 (fixed August 2020).
  //
  // This function will be a work in progress for many years.

  // unbiased_compare ignores SubD component types and relative topological relationships.
  // If unbiased_compare == 1, then A is "best" from this "unbiased" point of views.
  const int unbiased_compare = (ON_PickPoint::Compare(A.m_pick_point, B.m_pick_point)>=0) ? 1 : -1;
  
  const ON_SubDComponentPtr::Type A_component_type = A.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type B_component_type = B.m_component_ptr.ComponentType();
  if (A_component_type == B_component_type)
  {
    // A and B are the same type of component
    return (unbiased_compare >= 0) ? A : B;
  }
  if (ON_SubDComponentPtr::Type::Unset == A_component_type)
    return B;
  if (ON_SubDComponentPtr::Type::Unset == B_component_type)
    return A;

  // If we get this far, then A and B are pick events on different types of SubD components.

  // type_bias = 1 if A is a vertex and B is an edge/face or A is an edge and B is a face.
  // type_bias = -1 if B is a vertex and A is an edge/face or B is an edge and A is a face.
  const int type_bias = (ON_SubDComponentPtr::CompareComponentPtrType(A_component_type, B_component_type)) <= 0 ? 1 : -1;

  // 17 Dec 2024, Mikko, RH-85024:
  // Skip the following section if either component is a face. 
  // In that case it gives the wrong answer if you click on an opaque shaded SubD face, 
  // and at the same time hit an edge/vertex of the same face behind the shaded part.
  if (
    ON_PickType::PointPick == pick_type
    && ((type_bias >= 0) ? Internal_FirstIsPartOfSecond(A, B) : Internal_FirstIsPartOfSecond(B, A))
    && ON_SubDComponentPtr::Type::Face != A_component_type
    && ON_SubDComponentPtr::Type::Face != B_component_type
    )
  {
    // A point pick is occurring and best is a vertex on an edge/face or best is an edge on a face.
    // Bias towards the vertex/edge.
    // Users can pick the middle of an edge/face if they want the "bigger" component.
    ON_SubDComponentPoint best = (type_bias >= 0) ? A : B;
    best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
    best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    return best;
  }

  ON_PickPoint biased_A(A.m_pick_point);
  ON_PickPoint biased_B(B.m_pick_point);

  // distance bias applied to point picks on vertices and edges
  // Events with smaller distances are "better" because they are visually are closer to the picked point.
  if (ON_PickType::PointPick == pick_type)
  {
    // 18 Aug 2020 Dale Lear:
    //   The pick distance for a point pick is normalized so 1.0 = pick frustum radius. 
    //   Reasonable values for distance_tol are 0.25 to 1.0.
    //   0.5 fixes RH-52172
    //   1.0 seems to fix bugs like RH-59666 (0.5 is too small to fix RH-59666).
    const double distance_tol = 1.0;

    if ( type_bias > 0 && biased_A.m_distance > 0.0 && biased_A.m_distance <= distance_tol)
      biased_A.m_distance = 0.0; // consider pick A to be on the vertex/edge

    if ( type_bias < 0 && biased_B.m_distance > 0.0 && biased_B.m_distance <= distance_tol )
      biased_B.m_distance = 0.0; // consider pick B to be on the vertex/edge
  }

  // Apply a depth bias when we have a relative topological relationship between the components
  // (vertex on edge, vertex on face, or edge on face).
  // Events with larger depths are "better" because they are in front of smaller depths.
  double depth_bias = 0.0;
  const bool bHaveVertex = ON_SubDComponentPtr::Type::Vertex == A_component_type || ON_SubDComponentPtr::Type::Vertex == B_component_type;
  const bool bHaveEdge = ON_SubDComponentPtr::Type::Edge == A_component_type || ON_SubDComponentPtr::Type::Edge == B_component_type;
  const bool bHaveFace = ON_SubDComponentPtr::Type::Face == A_component_type || ON_SubDComponentPtr::Type::Face == B_component_type;
  if ( bHaveVertex && vertex_depth_bias > 0.0 && vertex_depth_bias < ON_UNSET_POSITIVE_VALUE  )
  {
    // One event is a vertex, the other event is an edge or face, and a vertex bias was supplied.
    // Test to see if the vertex is on the edge or face.
    if (Internal_FirstIsPartOfSecond(A,B))
    {
      // B is an edge/face and A is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_A.m_depth += depth_bias; // bias vertex closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is an edge/face and B is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_B.m_depth += depth_bias; // bias vertex closer
    }
  }
  else if ( bHaveEdge && bHaveFace && edge_depth_bias > 0.0  && edge_depth_bias < ON_UNSET_POSITIVE_VALUE )
  {
    // One event is an edge, the other event is a face, and an edge bias was supplied.
    // Test to see if the edge is on the face.
    if (Internal_FirstIsPartOfSecond(A, B))
    {
      // B is a face and A is an edge on the face
      depth_bias = edge_depth_bias;
      biased_A.m_depth += depth_bias; // bias edge closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is a face and B is an edge on the face
      depth_bias = edge_depth_bias;
      biased_B.m_depth += depth_bias; // bias edge closer
    }
  }

  // biased_compare adds a bias towards vertices and edges based on SubD component types and relative topological relationships.
  // If biased_compare >= 0, then A is "best" from this biased point of views.
  const int biased_compare = (ON_PickPoint::Compare(biased_A, biased_B)>=0) ? 1 : -1;

  ON_SubDComponentPoint best = (biased_compare >= 0) ? A : B;

  const ON_SubDComponentPtr::Type best_type = best.m_component_ptr.ComponentType();
  if ( ON_SubDComponentPtr::Type::Vertex == best_type || (ON_SubDComponentPtr::Type::Edge == best_type && bHaveFace) )
  {
    // Either a vertex was better than an edge/face or an edge was better than a face.
    if (fabs(A.m_pick_point.m_depth - B.m_pick_point.m_depth) <= depth_bias)
    {
      // The two pick points were "close" in depth.
      // In these cases, strengthen "best" by using the "best" depth and distance values from A and B.
      best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
      best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    }
  }

  return best;
}